

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicTrue_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicTrue_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicTrue)
{
    if( bool b = true )
        IUTEST_ASSERT_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_EXPECT_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_INFORM_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_ASSUME_TRUE(T<0, 0>::call(b)) << b;
}